

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetectorList::clearAllAccounting(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  bool bVar1;
  MemoryLeakDetectorNode *local_28;
  MemoryLeakDetectorNode *prev;
  MemoryLeakDetectorNode *cur;
  MemLeakPeriod period_local;
  MemoryLeakDetectorList *this_local;
  
  prev = this->head_;
  local_28 = (MemoryLeakDetectorNode *)0x0;
  do {
    while( true ) {
      if (prev == (MemoryLeakDetectorNode *)0x0) {
        return;
      }
      bVar1 = isInPeriod(this,prev,period);
      if (bVar1) break;
LAB_002a008e:
      local_28 = prev;
      prev = *(MemoryLeakDetectorNode **)(prev + 0x38);
    }
    if (local_28 != (MemoryLeakDetectorNode *)0x0) {
      *(undefined8 *)(local_28 + 0x38) = *(undefined8 *)(prev + 0x38);
      prev = local_28;
      goto LAB_002a008e;
    }
    this->head_ = *(MemoryLeakDetectorNode **)(prev + 0x38);
    prev = this->head_;
  } while( true );
}

Assistant:

void MemoryLeakDetectorList::clearAllAccounting(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;

    while (cur) {
        if (isInPeriod(cur, period)) {
            if (prev) {
                prev->next_ = cur->next_;
                cur = prev;
            }
            else {
                head_ = cur->next_;
                cur = head_;
                continue;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
}